

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::ImulExtendedCase::getInputValues
          (ImulExtendedCase *this,int numValues,void **values)

{
  undefined4 uVar1;
  undefined4 uVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 dVar5;
  uint uVar6;
  int iVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  Random rnd;
  deRandom local_40;
  
  dVar5 = deStringHash((this->super_IntegerFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_40,dVar5 ^ 0x224fa1);
  uVar6 = glu::getDataTypeScalarSize
                    ((((this->super_IntegerFunctionCase).m_spec.inputs.
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_start)->varType).m_data.basic.type);
  pvVar3 = *values;
  pvVar4 = values[1];
  iVar7 = 0;
  lVar11 = 0;
  do {
    if (0 < (int)uVar6) {
      uVar1 = (&DAT_0096b120)[lVar11 * 2];
      uVar2 = (&DAT_0096b124)[lVar11 * 2];
      uVar12 = (ulong)uVar6;
      iVar13 = iVar7;
      do {
        *(undefined4 *)((long)pvVar3 + (long)iVar13 * 4) = uVar1;
        *(undefined4 *)((long)pvVar4 + (long)iVar13 * 4) = uVar2;
        iVar13 = iVar13 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    lVar11 = lVar11 + 1;
    iVar7 = iVar7 + uVar6;
  } while (lVar11 != 7);
  if (7 < numValues) {
    iVar7 = uVar6 * 7;
    iVar13 = 7;
    do {
      uVar12 = (ulong)uVar6;
      iVar14 = iVar7;
      if (0 < (int)uVar6) {
        do {
          dVar5 = deRandom_getUint32(&local_40);
          dVar8 = deRandom_getUint32(&local_40);
          dVar9 = deRandom_getUint32(&local_40);
          dVar10 = deRandom_getUint32(&local_40);
          *(int *)((long)pvVar3 + (long)iVar14 * 4) =
               (int)dVar5 >> ((char)dVar9 + (char)(dVar9 / 0x15) * -0x15 & 0x1fU);
          *(int *)((long)pvVar4 + (long)iVar14 * 4) =
               (int)dVar8 >> ((char)dVar10 + (char)(dVar10 / 0x15) * -0x15 & 0x1fU);
          iVar14 = iVar14 + 1;
          uVar12 = uVar12 - 1;
        } while (uVar12 != 0);
      }
      iVar13 = iVar13 + 1;
      iVar7 = iVar7 + uVar6;
    } while (iVar13 != numValues);
  }
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0x224fa1u);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
//		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize	= glu::getDataTypeScalarSize(type);
		deUint32*				in0			= (deUint32*)values[0];
		deUint32*				in1			= (deUint32*)values[1];
		int						valueNdx	= 0;

		const struct
		{
			deUint32	x;
			deUint32	y;
		} easyCases[] =
		{
			{ 0x00000000u,	0x00000000u },
			{ 0xffffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x00000001u },
			{ 0x7fffffffu,	0x00000002u },
			{ 0x7fffffffu,	0x7fffffffu },
			{ 0xffffffffu,	0xffffffffu },
			{ 0x7fffffffu,	0xfffffffeu },
		};

		for (int easyCaseNdx = 0; easyCaseNdx < DE_LENGTH_OF_ARRAY(easyCases); easyCaseNdx++)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				in0[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].x;
				in1[valueNdx*scalarSize + compNdx] = (deInt32)easyCases[easyCaseNdx].y;
			}

			valueNdx += 1;
		}

		while (valueNdx < numValues)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const deInt32	base0	= (deInt32)rnd.getUint32();
				const deInt32	base1	= (deInt32)rnd.getUint32();
				const int		adj0	= rnd.getInt(0, 20);
				const int		adj1	= rnd.getInt(0, 20);
				in0[valueNdx*scalarSize + compNdx] = base0 >> adj0;
				in1[valueNdx*scalarSize + compNdx] = base1 >> adj1;
			}

			valueNdx += 1;
		}
	}